

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_class.c
# Opt level: O0

value class_metadata_methods_impl(char *name,size_t size,map methods)

{
  map_cb_iterate iterate_cb;
  value *args;
  value pvVar1;
  map in_RDX;
  class_metadata_iterator_args_type iterator;
  value *v_array;
  value v;
  size_t in_stack_ffffffffffffffb8;
  value *in_stack_ffffffffffffffc0;
  
  iterate_cb = (map_cb_iterate)
               value_create_array(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (iterate_cb != (map_cb_iterate)0x0) {
    args = value_to_array((value)0x126fa6);
    pvVar1 = value_create_string((char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    *args = pvVar1;
    if (*args != (value)0x0) {
      map_size(in_RDX);
      pvVar1 = value_create_array(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      args[1] = pvVar1;
      if (args[1] != (value)0x0) {
        map_iterate(in_RDX,iterate_cb,args);
        return iterate_cb;
      }
    }
    value_type_destroy((value)size);
  }
  return (value)0x0;
}

Assistant:

value class_metadata_methods_impl(const char name[], size_t size, map methods)
{
	value v = value_create_array(NULL, 2);
	value *v_array;

	if (v == NULL)
	{
		return NULL;
	}

	v_array = value_to_array(v);
	v_array[0] = value_create_string(name, size - 1);

	if (v_array[0] == NULL)
	{
		goto error_value;
	}

	v_array[1] = value_create_array(NULL, map_size(methods));

	if (v_array[1] == NULL)
	{
		goto error_value;
	}

	struct class_metadata_iterator_args_type iterator;

	iterator.v = v_array[1];
	iterator.count = 0;

	map_iterate(methods, &class_metadata_methods_impl_cb_iterate, &iterator);

	return v;
error_value:
	value_type_destroy(v);
	return NULL;
}